

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

intercept_t * __thiscall FPathTraverse::Next(FPathTraverse *this)

{
  uint uVar1;
  intercept_t *piVar2;
  long lVar3;
  intercept_t *scan;
  intercept_t *piVar4;
  double dVar5;
  
  uVar1 = this->intercept_index;
  if (uVar1 < intercepts.Count) {
    piVar4 = intercepts.Array + uVar1;
    lVar3 = (ulong)intercepts.Count - (ulong)uVar1;
    dVar5 = 3.4028234663852886e+38;
    piVar2 = (intercept_t *)0x0;
    do {
      if ((piVar4->frac < dVar5) && (piVar4->done == false)) {
        piVar2 = piVar4;
        dVar5 = piVar4->frac;
      }
      piVar4 = piVar4 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    if (piVar2 != (intercept_t *)0x0 && dVar5 <= 1.0) {
      piVar2->done = true;
      return piVar2;
    }
  }
  return (intercept_t *)0x0;
}

Assistant:

intercept_t *FPathTraverse::Next()
{
	intercept_t *in = NULL;

	double dist = FLT_MAX;
	for (unsigned scanpos = intercept_index; scanpos < intercepts.Size (); scanpos++)
	{
		intercept_t *scan = &intercepts[scanpos];
		if (scan->frac < dist && !scan->done)
		{
			dist = scan->frac;
			in = scan;
		}
	}
	
	if (dist > 1. || in == NULL) return NULL;	// checked everything in range			
	in->done = true;
	return in;
}